

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O2

char minijson::detail::read_unquoted_value<minijson::buffer_context>
               (buffer_context *context,char first_char)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  long lVar5;
  char cVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  
  iVar8 = (int)CONCAT71(in_register_00000031,first_char);
  uVar7 = CONCAT71(in_register_00000031,first_char) & 0xffffffff;
  if ((char)uVar7 == '\0') goto LAB_00106ee3;
  do {
    iVar8 = (int)(char)uVar7;
    buffer_context_base::write(&context->super_buffer_context_base,iVar8,in_RDX,in_RCX);
    in_RDX = extraout_RDX;
LAB_00106ee3:
    uVar3 = buffer_context_base::read(&context->super_buffer_context_base,iVar8,in_RDX,in_RCX);
    uVar7 = uVar3 & 0xffffffff;
    cVar6 = (char)uVar7;
    __buf = extraout_RDX_00;
    if ((char)uVar3 == ',') goto LAB_00106f15;
    uVar2 = (uint)uVar3 & 0xff;
    if ((uVar2 == 0x5d) || (uVar2 == 0x7d)) goto LAB_00106f15;
    if ((uVar3 & 0xff) == 0) goto LAB_00106f28;
    iVar8 = isspace((int)cVar6);
    in_RDX = extraout_RDX_01;
  } while (iVar8 == 0);
  __buf = extraout_RDX_01;
  if (cVar6 == '\0') {
LAB_00106f28:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar4 = &PTR__exception_0010bd68;
    sVar1 = (context->super_buffer_context_base).m_read_offset;
    lVar5 = 0;
    if (sVar1 != 0) {
      lVar5 = sVar1 - 1;
    }
    puVar4[1] = lVar5;
    *(undefined4 *)(puVar4 + 2) = 7;
    __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
  }
LAB_00106f15:
  buffer_context_base::write(&context->super_buffer_context_base,0,__buf,in_RCX);
  return cVar6;
}

Assistant:

char read_unquoted_value(Context& context, char first_char = 0)
{
    if (first_char != 0)
    {
        context.write(first_char);
    }

    char c;

    while (((c = context.read()) != 0) && (c != ',') && (c != '}') && (c != ']') && !isspace(c))
    {
        context.write(c);
    }

    if (c == 0)
    {
        throw parse_error(context, parse_error::UNTERMINATED_VALUE);
    }

    context.write(0);

    return c; // return the termination character (or it will be lost forever)
}